

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_delphi_generator.cc
# Opt level: O2

void __thiscall
t_delphi_generator::generate_delphi_property_reader_impl
          (t_delphi_generator *this,ostream *out,string *cls_prefix,string *name,t_type *type,
          t_field *tfield,string fieldPrefix,bool is_xception_class)

{
  t_type *ttype;
  int iVar1;
  ostream *poVar2;
  string local_70;
  string local_50;
  
  ttype = tfield->type_;
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype);
  poVar2 = indent_impl(this,out);
  poVar2 = std::operator<<(poVar2,"function ");
  poVar2 = std::operator<<(poVar2,(string *)cls_prefix);
  poVar2 = std::operator<<(poVar2,(string *)name);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = std::operator<<(poVar2,"Get");
  prop_name_abi_cxx11_(&local_70,this,tfield,fieldPrefix._M_string_length._0_1_);
  poVar2 = std::operator<<(poVar2,(string *)&local_70);
  poVar2 = std::operator<<(poVar2,": ");
  type_name_abi_cxx11_(&local_50,this,ttype,false,true,SUB41(iVar1,0),true);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  poVar2 = std::operator<<(poVar2,";");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  poVar2 = indent_impl(this,out);
  poVar2 = std::operator<<(poVar2,"begin");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  this->indent_impl_ = this->indent_impl_ + 1;
  poVar2 = indent_impl(this,out);
  poVar2 = std::operator<<(poVar2,"Result := ");
  poVar2 = std::operator<<(poVar2,(string *)fieldPrefix._M_dataplus._M_p);
  prop_name_abi_cxx11_(&local_70,this,tfield,fieldPrefix._M_string_length._0_1_);
  poVar2 = std::operator<<(poVar2,(string *)&local_70);
  poVar2 = std::operator<<(poVar2,";");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  this->indent_impl_ = this->indent_impl_ + -1;
  poVar2 = indent_impl(this,out);
  poVar2 = std::operator<<(poVar2,"end;");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_delphi_generator::generate_delphi_property_reader_impl(ostream& out,
                                                              std::string cls_prefix,
                                                              std::string name,
                                                              t_type* type,
                                                              t_field* tfield,
                                                              std::string fieldPrefix,
                                                              bool is_xception_class) {
  (void)type;

  t_type* ftype = tfield->get_type();
  bool is_xception = ftype->is_xception();

  indent_impl(out) << "function " << cls_prefix << name << "."
                   << "Get" << prop_name(tfield, is_xception_class) << ": "
                   << type_name(ftype, false, true, is_xception, true) << ";" << endl;
  indent_impl(out) << "begin" << endl;
  indent_up_impl();
  indent_impl(out) << "Result := " << fieldPrefix << prop_name(tfield, is_xception_class) << ";"
                   << endl;
  indent_down_impl();
  indent_impl(out) << "end;" << endl << endl;
}